

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuiScope.cpp
# Opt level: O3

Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
GuiScope::writeExport
          (Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,GuiScope *this,string_view config,UniformsMap *uniforms)

{
  pointer *ppSVar1;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  _Alloc_hider _Stack_40;
  _Alloc_hider _Stack_20;
  
  local_58 = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Not implemented","",config._M_str);
  if (local_58 == (pointer)&local_48) {
    _Stack_20._M_p = _Stack_40._M_p;
    local_58 = (pointer)&stack0xffffffffffffffd8;
  }
  ppSVar1 = &(__return_storage_ptr__->field_0).value_.sections.
             super__Vector_base<Section,_std::allocator<Section>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  (__return_storage_ptr__->field_0).value_.sections.
  super__Vector_base<Section,_std::allocator<Section>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)ppSVar1;
  if (local_58 == (pointer)&stack0xffffffffffffffd8) {
    *ppSVar1 = local_48;
    *(pointer *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
         _Stack_20._M_p;
  }
  else {
    (__return_storage_ptr__->field_0).value_.sections.
    super__Vector_base<Section,_std::allocator<Section>_>._M_impl.super__Vector_impl_data._M_start =
         local_58;
    (__return_storage_ptr__->field_0).value_.sections.
    super__Vector_base<Section,_std::allocator<Section>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_48;
  }
  (__return_storage_ptr__->field_0).value_.sections.
  super__Vector_base<Section,_std::allocator<Section>_>._M_impl.super__Vector_impl_data._M_finish =
       local_50;
  __return_storage_ptr__->has_value_ = false;
  return __return_storage_ptr__;
}

Assistant:

Expected<IAutomation::ExportResult, std::string> GuiScope::writeExport(std::string_view config, const shader::UniformsMap &uniforms) const {
	return Unexpected(std::string("Not implemented"));
}